

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall TApp_RecoverSubcommands_Test::TestBody(TApp_RecoverSubcommands_Test *this)

{
  initializer_list<CLI::App_*> __l;
  bool bVar1;
  App *pAVar2;
  char *message;
  AssertHelper local_208;
  Message local_200;
  allocator<CLI::App_*> local_1f1;
  App *local_1f0;
  App *local_1e8;
  App *local_1e0;
  App *local_1d8;
  iterator local_1d0;
  size_type local_1c8;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_1c0;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_1a8;
  undefined1 local_190 [8];
  AssertionResult gtest_ar;
  string local_178;
  allocator local_151;
  string local_150;
  App *local_130;
  App *app4;
  string local_120;
  allocator local_f9;
  string local_f8;
  App *local_d8;
  App *app3;
  string local_c8;
  allocator local_a1;
  string local_a0;
  App *local_80;
  App *app2;
  string local_70;
  allocator local_39;
  string local_38;
  App *local_18;
  App *app1;
  TApp_RecoverSubcommands_Test *this_local;
  
  app1 = (App *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"app1",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)((long)&app2 + 7));
  pAVar2 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&app2 + 7));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pAVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"app2",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"",(allocator *)((long)&app3 + 7));
  pAVar2 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_a0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&app3 + 7));
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_80 = pAVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"app3",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"",(allocator *)((long)&app4 + 7));
  pAVar2 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_f8,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)((long)&app4 + 7));
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  local_d8 = pAVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"app4",&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_178,"",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  pAVar2 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_150,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  local_130 = pAVar2;
  CLI::App::get_subcommands(&local_1a8,&(this->super_TApp).app,false);
  local_1f0 = local_18;
  local_1e8 = local_80;
  local_1e0 = local_d8;
  local_1d8 = local_130;
  local_1d0 = &local_1f0;
  local_1c8 = 4;
  CLI::std::allocator<CLI::App_*>::allocator(&local_1f1);
  __l._M_len = local_1c8;
  __l._M_array = local_1d0;
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector(&local_1c0,__l,&local_1f1);
  testing::internal::EqHelper<false>::
  Compare<std::vector<CLI::App*,std::allocator<CLI::App*>>,std::vector<CLI::App*,std::allocator<CLI::App*>>>
            ((EqHelper<false> *)local_190,"app.get_subcommands(false)",
             "std::vector<CLI::App *>({app1, app2, app3, app4})",&local_1a8,&local_1c0);
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector(&local_1c0);
  CLI::std::allocator<CLI::App_*>::~allocator(&local_1f1);
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector(&local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x4e,message);
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  return;
}

Assistant:

TEST_F(TApp, RecoverSubcommands) {
    CLI::App *app1 = app.add_subcommand("app1");
    CLI::App *app2 = app.add_subcommand("app2");
    CLI::App *app3 = app.add_subcommand("app3");
    CLI::App *app4 = app.add_subcommand("app4");

    EXPECT_EQ(app.get_subcommands(false), std::vector<CLI::App *>({app1, app2, app3, app4}));
}